

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

iterator __thiscall
fmt::v8::detail::default_arg_formatter<wchar_t>::operator()
          (default_arg_formatter<wchar_t> *this,handle h)

{
  iterator iVar1;
  undefined1 local_78 [8];
  context format_ctx;
  basic_string_view<wchar_t> local_50;
  undefined1 local_40 [8];
  basic_format_parse_context<wchar_t,_fmt::v8::detail::error_handler> parse_ctx;
  default_arg_formatter<wchar_t> *this_local;
  handle h_local;
  
  h_local.custom_.value = h.custom_.format;
  this_local = (default_arg_formatter<wchar_t> *)h.custom_.value;
  parse_ctx._16_8_ = this;
  basic_string_view<wchar_t>::basic_string_view(&local_50);
  basic_format_parse_context<wchar_t,_fmt::v8::detail::error_handler>::basic_format_parse_context
            ((basic_format_parse_context<wchar_t,_fmt::v8::detail::error_handler> *)local_40,
             local_50.data_,local_50.size_,0);
  basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>,_wchar_t>::
  basic_format_context
            ((basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>,_wchar_t>
              *)local_78,(this->out).container,this->args,(locale_ref)(this->loc).locale_);
  basic_format_arg<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>,_wchar_t>_>
  ::handle::format((handle *)&this_local,(parse_context_type *)local_40,
                   (basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>,_wchar_t>
                    *)local_78);
  iVar1 = basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>,_wchar_t>
          ::out((basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>,_wchar_t>
                 *)local_78);
  return (iterator)iVar1.container;
}

Assistant:

auto operator()(typename basic_format_arg<context>::handle h) -> iterator {
    basic_format_parse_context<Char> parse_ctx({});
    context format_ctx(out, args, loc);
    h.format(parse_ctx, format_ctx);
    return format_ctx.out();
  }